

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.h
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::InsertVariables(ChSystemDescriptor *this,ChVariables *mv)

{
  ChVariables *local_8;
  
  local_8 = mv;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::push_back
            (&this->vvariables,&local_8);
  return;
}

Assistant:

virtual void InsertVariables(ChVariables* mv) { vvariables.push_back(mv); }